

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool parse_args(char ***argv,path *input,path *output,DataInfo *data,ConfigInfo *conf,
               Options *options)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  path *__lhs;
  size_t sVar6;
  undefined8 uVar7;
  long lVar8;
  ConfigInfo *pCVar9;
  char *pcVar10;
  char **ppcVar11;
  char *pcVar12;
  bool flag;
  int32_t temp_i32;
  optional<std::string> opt_cmdline;
  char *o;
  char **argv2;
  char *path_1;
  small_vector<char_*,_128> args;
  bool local_5e1;
  Options *local_5e0;
  uint local_5d4;
  ConfigInfo *local_5d0;
  uint local_5c4;
  uint local_5c0;
  uint local_5bc;
  path *local_5b8;
  DataInfo *local_5b0;
  path *local_5a8;
  optional<std::string> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_538;
  uint32_t *local_530;
  int32_t *local_528;
  string *local_520;
  vector<std::experimental::filesystem::v1::__cxx11::path,std::allocator<std::experimental::filesystem::v1::__cxx11::path>>
  *local_518;
  char *local_510;
  path local_508;
  path local_4c8;
  path local_488;
  path local_448 [16];
  
  ppcVar11 = *argv;
  pcVar4 = *ppcVar11;
  if (pcVar4 != (char *)0x0) {
    local_518 = (vector<std::experimental::filesystem::v1::__cxx11::path,std::allocator<std::experimental::filesystem::v1::__cxx11::path>>
                 *)&conf->add_config_files;
    local_520 = (string *)&data->levelfile;
    local_528 = &options->timer_index;
    local_530 = &options->local_var_limit;
    local_538 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 *)&options->defines;
    local_5e0 = options;
    local_5d0 = conf;
    local_5b8 = input;
    local_5b0 = data;
    local_5a8 = output;
    do {
      if (*pcVar4 == '-') {
        iVar2 = strncmp(pcVar4,"--help",0x7fffffff);
        if (((iVar2 == 0) || (iVar2 = strncmp(pcVar4,"-h",2), iVar2 == 0)) &&
           (*argv = ppcVar11 + 1, *ppcVar11 != (char *)0x0)) {
          options->help = true;
          return true;
        }
        ppcVar11 = *argv;
        if (*ppcVar11 == (char *)0x0) {
LAB_0017d699:
          __assert_fail("*argv != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/cpp/argv.hpp"
                        ,0x1b,"char *optget(char **&, const char *, const char *, size_t)");
        }
        iVar2 = strncmp(*ppcVar11,"--version",0x7fffffff);
        if ((iVar2 == 0) && (*argv = ppcVar11 + 1, *ppcVar11 != (char *)0x0)) {
          local_5e0->version = true;
          return true;
        }
        local_510 = optget(argv,"-o",(char *)0x0,1);
        if (local_510 == (char *)0x0) {
          ppcVar11 = *argv;
          if (*ppcVar11 == (char *)0x0) goto LAB_0017d699;
          iVar2 = strncmp(*ppcVar11,"-pedantic-errors",0x7fffffff);
          if ((iVar2 == 0) && (*argv = ppcVar11 + 1, *ppcVar11 != (char *)0x0)) {
            local_5e0->pedantic = true;
            local_5e0->pedantic_errors = true;
            options = local_5e0;
          }
          else {
            ppcVar11 = *argv;
            if (*ppcVar11 == (char *)0x0) goto LAB_0017d699;
            iVar2 = strncmp(*ppcVar11,"-pedantic",0x7fffffff);
            if ((iVar2 == 0) && (*argv = ppcVar11 + 1, *ppcVar11 != (char *)0x0)) {
              local_5e0->pedantic = true;
              options = local_5e0;
            }
            else {
              ppcVar11 = *argv;
              if (*ppcVar11 == (char *)0x0) goto LAB_0017d699;
              iVar2 = strncmp(*ppcVar11,"--guesser",0x7fffffff);
              if ((iVar2 == 0) && (*argv = ppcVar11 + 1, *ppcVar11 != (char *)0x0)) {
                local_5e0->guesser = true;
                options = local_5e0;
              }
              else {
                pcVar4 = optget(argv,(char *)0x0,"--expect-var",1);
                options = local_5e0;
                if (pcVar4 == (char *)0x0) {
                  ppcVar11 = *argv;
                  if (*ppcVar11 == (char *)0x0) goto LAB_0017d699;
                  iVar2 = strncmp(*ppcVar11,"--recursive-traversal",0x7fffffff);
                  if ((iVar2 == 0) && (*argv = ppcVar11 + 1, *ppcVar11 != (char *)0x0)) {
                    local_5e0->linear_sweep = false;
                    options = local_5e0;
                  }
                  else {
                    pcVar4 = optget(argv,(char *)0x0,"--config",1);
                    pCVar9 = local_5d0;
                    if (pcVar4 != (char *)0x0) {
                      sVar6 = (local_5d0->config_name)._M_string_length;
                      sVar5 = strlen(pcVar4);
                      if ((sVar6 == sVar5) &&
                         (iVar2 = strncasecmp((pCVar9->config_name)._M_dataplus._M_p,pcVar4,sVar6),
                         iVar2 == 0)) goto LAB_0017c678;
                      std::__cxx11::string::operator=((string *)pCVar9,pcVar4);
                      __lhs = config_path_abi_cxx11_();
                      std::experimental::filesystem::v1::__cxx11::path::
                      path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                                (&local_4c8,&local_5d0->config_name);
                      std::experimental::filesystem::v1::__cxx11::operator/
                                (&local_508,__lhs,&local_4c8);
                      options = local_5e0;
                      std::experimental::filesystem::v1::__cxx11::path::
                      path<char[16],std::experimental::filesystem::v1::__cxx11::path>
                                (&local_488,(char (*) [16])"commandline.txt");
                      std::experimental::filesystem::v1::__cxx11::operator/
                                (local_448,&local_508,&local_488);
                      read_file_utf8(&local_5a0,local_448);
                      std::experimental::filesystem::v1::__cxx11::path::~path(local_448);
                      std::experimental::filesystem::v1::__cxx11::path::~path(&local_488);
                      std::experimental::filesystem::v1::__cxx11::path::~path(&local_508);
                      std::experimental::filesystem::v1::__cxx11::path::~path(&local_4c8);
                      if (local_5a0.super_OptionalBase<std::__cxx11::basic_string<char>_>.init_ ==
                          true) {
                        uVar7 = local_5a0.super_OptionalBase<std::__cxx11::basic_string<char>_>.
                                storage_.value_._M_string_length;
                        if ((char *)local_5a0.super_OptionalBase<std::__cxx11::basic_string<char>_>.
                                    storage_.value_._M_string_length != (char *)0x0) {
                          uVar7 = local_5a0.super_OptionalBase<std::__cxx11::basic_string<char>_>.
                                  storage_.value_._M_dataplus._M_p;
                        }
                        local_448[0]._M_pathname._M_dataplus._M_p =
                             local_448[0]._M_pathname.field_2._M_local_buf + 8;
                        local_448[0]._M_pathname.field_2._0_8_ = &stack0xffffffffffffffd0;
                        pCVar9 = local_5d0;
                        local_448[0]._M_pathname._M_string_length =
                             (size_type)local_448[0]._M_pathname._M_dataplus._M_p;
                        if ((char *)local_5a0.super_OptionalBase<std::__cxx11::basic_string<char>_>.
                                    storage_.value_._M_string_length != (char *)0x0) {
                          pcVar4 = (char *)(uVar7 + local_5a0.
                                                                                                        
                                                  super_OptionalBase<std::__cxx11::basic_string<char>_>
                                                  .storage_.value_._M_string_length);
                          do {
                            lVar8 = (long)pcVar4 - uVar7 >> 2;
                            pcVar10 = (char *)uVar7;
                            if (0 < lVar8) {
                              pcVar10 = (char *)(uVar7 + ((long)pcVar4 - uVar7 & 0xfffffffffffffffc)
                                                );
                              lVar8 = lVar8 + 1;
                              pcVar12 = (char *)(uVar7 + 3);
                              do {
                                iVar2 = isspace((int)pcVar12[-3]);
                                if (iVar2 == 0) {
                                  pcVar12 = pcVar12 + -3;
                                  goto LAB_0017ca49;
                                }
                                iVar2 = isspace((int)pcVar12[-2]);
                                if (iVar2 == 0) {
                                  pcVar12 = pcVar12 + -2;
                                  goto LAB_0017ca49;
                                }
                                iVar2 = isspace((int)pcVar12[-1]);
                                if (iVar2 == 0) {
                                  pcVar12 = pcVar12 + -1;
                                  goto LAB_0017ca49;
                                }
                                iVar2 = isspace((int)*pcVar12);
                                if (iVar2 == 0) goto LAB_0017ca49;
                                lVar8 = lVar8 + -1;
                                pcVar12 = pcVar12 + 4;
                              } while (1 < lVar8);
                            }
                            lVar8 = (long)pcVar4 - (long)pcVar10;
                            if (lVar8 == 1) {
LAB_0017ca1d:
                              iVar2 = isspace((int)*pcVar10);
                              pcVar12 = pcVar10;
                              if (iVar2 != 0) {
                                pcVar12 = pcVar4;
                              }
                            }
                            else {
                              pcVar12 = pcVar10;
                              if (lVar8 == 2) {
LAB_0017ca09:
                                iVar2 = isspace((int)*pcVar12);
                                if (iVar2 != 0) {
                                  pcVar10 = pcVar12 + 1;
                                  goto LAB_0017ca1d;
                                }
                              }
                              else {
                                pcVar12 = pcVar4;
                                if ((lVar8 == 3) &&
                                   (iVar2 = isspace((int)*pcVar10), pcVar12 = pcVar10, iVar2 != 0))
                                {
                                  pcVar12 = pcVar10 + 1;
                                  goto LAB_0017ca09;
                                }
                              }
                            }
LAB_0017ca49:
                            if ((ulong)local_448[0]._M_pathname.field_2._0_8_ <=
                                local_448[0]._M_pathname._M_string_length) {
                              llvm_vecsmall::SmallVectorTemplateCommon<char_*,_void>::grow_pod
                                        ((SmallVectorTemplateCommon<char_*,_void> *)local_448,0,8);
                            }
                            *(char **)local_448[0]._M_pathname._M_string_length = pcVar12;
                            local_448[0]._M_pathname._M_string_length =
                                 local_448[0]._M_pathname._M_string_length + 8;
                            lVar8 = (long)pcVar4 - (long)pcVar12 >> 2;
                            pcVar10 = pcVar12;
                            if (0 < lVar8) {
                              pcVar10 = pcVar12 + ((long)pcVar4 - (long)pcVar12 & 0xfffffffffffffffc
                                                  );
                              lVar8 = lVar8 + 1;
                              uVar7 = pcVar12 + 3;
                              do {
                                iVar2 = isspace((int)*(char *)(uVar7 + -3));
                                if (iVar2 != 0) {
                                  pCVar9 = local_5d0;
                                  options = local_5e0;
                                  uVar7 = (char *)(uVar7 + -3);
                                  goto LAB_0017cb4e;
                                }
                                iVar2 = isspace((int)*(char *)(uVar7 + -2));
                                if (iVar2 != 0) {
                                  pCVar9 = local_5d0;
                                  options = local_5e0;
                                  uVar7 = (char *)(uVar7 + -2);
                                  goto LAB_0017cb4e;
                                }
                                iVar2 = isspace((int)*(char *)(uVar7 + -1));
                                if (iVar2 != 0) {
                                  pCVar9 = local_5d0;
                                  options = local_5e0;
                                  uVar7 = (char *)(uVar7 + -1);
                                  goto LAB_0017cb4e;
                                }
                                iVar2 = isspace((int)*(char *)uVar7);
                                pCVar9 = local_5d0;
                                options = local_5e0;
                                if (iVar2 != 0) goto LAB_0017cb4e;
                                lVar8 = lVar8 + -1;
                                uVar7 = uVar7 + 4;
                              } while (1 < lVar8);
                            }
                            pCVar9 = local_5d0;
                            options = local_5e0;
                            lVar8 = (long)pcVar4 - (long)pcVar10;
                            if (lVar8 == 1) {
LAB_0017cb70:
                              iVar2 = isspace((int)*pcVar10);
                              uVar7 = pcVar10;
                              if (iVar2 == 0) {
                                uVar7 = pcVar4;
                              }
                            }
                            else if (lVar8 == 2) {
LAB_0017cb22:
                              iVar2 = isspace((int)*pcVar10);
                              uVar7 = pcVar10;
                              if (iVar2 == 0) {
                                pcVar10 = pcVar10 + 1;
                                goto LAB_0017cb70;
                              }
                            }
                            else {
                              uVar7 = pcVar4;
                              if ((lVar8 == 3) &&
                                 (iVar2 = isspace((int)*pcVar10), uVar7 = pcVar10, iVar2 == 0)) {
                                pcVar10 = pcVar10 + 1;
                                goto LAB_0017cb22;
                              }
                            }
LAB_0017cb4e:
                            if ((char *)uVar7 != pcVar4) {
                              *(char *)uVar7 = '\0';
                              uVar7 = uVar7 + 1;
                            }
                          } while ((char *)uVar7 != pcVar4);
                        }
                        local_508._M_pathname._M_dataplus._M_p = (pointer)0x0;
                        llvm_vecsmall::SmallVectorImpl<char*>::emplace_back<decltype(nullptr)>
                                  ((SmallVectorImpl<char*> *)local_448,(void **)&local_508);
                        local_508._M_pathname._M_dataplus._M_p =
                             local_448[0]._M_pathname._M_dataplus._M_p;
                        bVar1 = parse_args((char ***)&local_508,local_5b8,local_5a8,local_5b0,pCVar9
                                           ,options);
                        if (local_448[0]._M_pathname._M_dataplus._M_p !=
                            (char *)((long)&local_448[0]._M_pathname.field_2 + 8)) {
                          free(local_448[0]._M_pathname._M_dataplus._M_p);
                        }
                        if ((local_5a0.super_OptionalBase<std::__cxx11::basic_string<char>_>.init_
                             == true) &&
                           (local_5a0.super_OptionalBase<std::__cxx11::basic_string<char>_>.storage_
                            .value_._M_dataplus._M_p !=
                            (pointer)((long)&local_5a0.
                                             super_OptionalBase<std::__cxx11::basic_string<char>_>.
                                             storage_ + 0x10))) {
                          operator_delete((void *)local_5a0.
                                                  super_OptionalBase<std::__cxx11::basic_string<char>_>
                                                  .storage_.value_._M_dataplus._M_p,
                                          local_5a0.
                                          super_OptionalBase<std::__cxx11::basic_string<char>_>.
                                          storage_._16_8_ + 1);
                        }
                        bVar1 = !bVar1;
                      }
                      else {
                        parse_args();
                        bVar1 = true;
                      }
                      goto LAB_0017ccec;
                    }
                    local_508._M_pathname._M_dataplus._M_p =
                         optget(argv,(char *)0x0,"--add-config",1);
                    options = local_5e0;
                    if (local_508._M_pathname._M_dataplus._M_p == (char *)0x0) {
                      local_4c8._M_pathname._M_dataplus._M_p =
                           optget(argv,(char *)0x0,"--datadir",1);
                      if (local_4c8._M_pathname._M_dataplus._M_p == (char *)0x0) {
                        pcVar4 = optget(argv,(char *)0x0,"--levelfile",1);
                        if (pcVar4 == (char *)0x0) {
                          pcVar4 = optget(argv,(char *)0x0,"--error-format",1);
                          if (pcVar4 == (char *)0x0) {
                            pcVar4 = optget(argv,(char *)0x0,"-mheader",1);
                            if (pcVar4 == (char *)0x0) {
                              pcVar4 = optflag(argv,"-mno-header",(bool *)0x0);
                              if (pcVar4 == (char *)0x0) {
                                pcVar4 = optflag(argv,"-moatc",&local_5e1);
                                if (pcVar4 == (char *)0x0) {
                                  pcVar4 = optflag(argv,"-mq11.4",&local_5e1);
                                  if (pcVar4 == (char *)0x0) {
                                    pcVar4 = optflag(argv,"-mtyped-text-label",&local_5e1);
                                    if (pcVar4 == (char *)0x0) {
                                      pcVar4 = optflag(argv,"-moptimize-andor",&local_5e1);
                                      if (pcVar4 == (char *)0x0) {
                                        pcVar4 = optflag(argv,"-moptimize-zero",&local_5e1);
                                        if (pcVar4 == (char *)0x0) {
                                          pcVar4 = optget(argv,(char *)0x0,"-O",0);
                                          if (pcVar4 == (char *)0x0) {
                                            pcVar4 = optflag(argv,"-fentity-tracking",&local_5e1);
                                            if (pcVar4 == (char *)0x0) {
                                              pcVar4 = optflag(argv,"-fscript-name-check",&local_5e1
                                                              );
                                              if (pcVar4 == (char *)0x0) {
                                                pcVar4 = optflag(argv,"-frelax-not",&local_5e1);
                                                if (pcVar4 == (char *)0x0) {
                                                  pcVar4 = optflag(argv,"-fswitch",&local_5e1);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optflag(argv,"-fbreak-continue",
                                                                     (bool *)0x0);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag(argv,"-fscope-then-label",
                                                                       &local_5e1);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optflag(argv,"-funderscore-idents",
                                                                         &local_5e1);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optflag(argv,"-farrays",
                                                                           &local_5e1);
                                                          if (pcVar4 == (char *)0x0) {
                                                            pcVar4 = optflag(argv,"-fconst",
                                                                             &local_5e1);
                                                            if (pcVar4 == (char *)0x0) {
                                                              pcVar4 = optflag(argv,
                                                  "-fstreamed-scripts",&local_5e1);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optflag(argv,"-ftext-label-vars",
                                                                     &local_5e1);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag(argv,"-fskip-cutscene",
                                                                       &local_5e1);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optflag(argv,"-mlocal-offsets",
                                                                         (bool *)0x0);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optint<int>(argv,"-ftimer-index",
                                                                               local_528,10);
                                                          options = local_5e0;
                                                          if ((pcVar4 == (char *)0x0) &&
                                                             (pcVar4 = optint<unsigned_int>
                                                                                 (argv,
                                                  "-flocal-var-limit",local_530,10),
                                                  options = local_5e0, pcVar4 == (char *)0x0)) {
                                                    pcVar4 = optint<int>(argv,"-fmission-var-limit",
                                                                         (int *)&local_5d4,10);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optint<int>(argv,
                                                  "-fmission-var-begin",(int *)&local_5d4,10);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optint<int>(argv,"-fswitch-case-limit",
                                                                         (int *)&local_5d4,10);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optint<int>(argv,"-farray-elem-limit"
                                                                           ,(int *)&local_5d4,10);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optflag(argv,"-fsyntax-only",
                                                                         (bool *)0x0);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optflag(argv,"-emit-ir2",
                                                                           (bool *)0x0);
                                                          if (pcVar4 == (char *)0x0) {
                                                            pcVar4 = optflag(argv,"-fcleo",
                                                                             (bool *)0x0);
                                                            if (pcVar4 == (char *)0x0) {
                                                              pcVar4 = optget(argv,(char *)0x0,
                                                                              "--cs",0);
                                                              if (pcVar4 == (char *)0x0) {
                                                                pcVar4 = optget(argv,(char *)0x0,
                                                                                "--cm",0);
                                                                if (pcVar4 == (char *)0x0) {
                                                                  pcVar4 = optflag(argv,
                                                  "-fmission-script",(bool *)0x0);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optflag(argv,"-Werror",&local_5e1);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag(argv,
                                                  "-Wconflict-text-label-var",&local_5e1);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optflag(argv,"-Wexpect-var",&local_5e1)
                                                    ;
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag(argv,"-fconstant-checks",
                                                                       &local_5e1);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optget(argv,"-D","--define",1);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optget(argv,"-U","--undefine",1);
                                                          if (pcVar4 == (char *)0x0) {
                                                            parse_args();
                                                            options = local_5e0;
                                                            goto LAB_0017c777;
                                                          }
                                                          local_448[0]._M_pathname._M_dataplus._M_p
                                                               = pcVar4;
                                                          local_448[0]._M_pathname._M_string_length
                                                               = strlen(pcVar4);
                                                          Options::undefine(local_5e0,
                                                                            (string_view *)local_448
                                                                           );
                                                          options = local_5e0;
                                                        }
                                                        else {
                                                          local_558._M_dataplus._M_p =
                                                               (pointer)&local_558.field_2;
                                                          sVar6 = strlen(pcVar4);
                                                          std::__cxx11::string::
                                                          _M_construct<char_const*>
                                                                    ((string *)&local_558,pcVar4,
                                                                     pcVar4 + sVar6);
                                                          local_578._M_dataplus._M_p =
                                                               (pointer)&local_578.field_2;
                                                          std::__cxx11::string::
                                                          _M_construct<char_const*>
                                                                    ((string *)&local_578,"1","");
                                                          std::
                                                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                                  ::
                                                  _M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                                                            (local_538,&local_558,&local_578);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_578._M_dataplus._M_p != &local_578.field_2
                                                  ) {
                                                    operator_delete(local_578._M_dataplus._M_p,
                                                                    local_578.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  options = local_5e0;
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_558._M_dataplus._M_p != &local_558.field_2
                                                  ) {
                                                    operator_delete(local_558._M_dataplus._M_p,
                                                                    local_558.field_2.
                                                                    _M_allocated_capacity + 1);
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->constant_checks = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->warn_expect_var = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->warn_conflict_text_label_var =
                                                         local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->warning_is_error = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->mission_script = true;
                                                    options = local_5e0;
                                                  }
                                                  goto LAB_0017ccea;
                                                  }
                                                  (local_5e0->cleo).
                                                  super_OptionalBase<unsigned_char> =
                                                       (OptionalBase<unsigned_char>)0x1;
                                                  local_5e0->output_cleo = true;
                                                  local_5e0->mission_script = true;
                                                  }
                                                  else {
                                                    (local_5e0->cleo).
                                                    super_OptionalBase<unsigned_char> =
                                                         (OptionalBase<unsigned_char>)0x1;
                                                    local_5e0->output_cleo = true;
                                                    local_5e0->mission_script = false;
                                                  }
                                                  local_5e0->headerless = true;
                                                  local_5e0->use_local_offsets = true;
                                                  options = local_5e0;
                                                  }
                                                  else {
                                                    (local_5e0->cleo).
                                                    super_OptionalBase<unsigned_char> =
                                                         (OptionalBase<unsigned_char>)0x1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->emit_ir2 = true;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->fsyntax_only = true;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5c4 = local_5c4 & 0xffffff00;
                                                    if (-1 < (int)local_5d4) {
                                                      local_5c4 = local_5d4;
                                                    }
                                                    options = local_5e0;
                                                    if ((local_5e0->array_elem_limit).
                                                        super_OptionalBase<unsigned_int>.init_ ==
                                                        true) {
                                                      if ((int)local_5d4 < 0) {
                                                        (local_5e0->array_elem_limit).
                                                        super_OptionalBase<unsigned_int>.init_ =
                                                             false;
                                                      }
                                                      else {
                                                        (local_5e0->array_elem_limit).
                                                        super_OptionalBase<unsigned_int>.storage_.
                                                        value_ = local_5c4;
                                                      }
                                                    }
                                                    else if (-1 < (int)local_5d4) {
                                                      (local_5e0->array_elem_limit).
                                                      super_OptionalBase<unsigned_int>.storage_.
                                                      value_ = local_5c4;
                                                      (local_5e0->array_elem_limit).
                                                      super_OptionalBase<unsigned_int>.init_ = true;
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    local_5c0 = local_5c0 & 0xffffff00;
                                                    if (-1 < (int)local_5d4) {
                                                      local_5c0 = local_5d4;
                                                    }
                                                    options = local_5e0;
                                                    if ((local_5e0->switch_case_limit).
                                                        super_OptionalBase<unsigned_int>.init_ ==
                                                        true) {
                                                      if ((int)local_5d4 < 0) {
                                                        (local_5e0->switch_case_limit).
                                                        super_OptionalBase<unsigned_int>.init_ =
                                                             false;
                                                      }
                                                      else {
                                                        (local_5e0->switch_case_limit).
                                                        super_OptionalBase<unsigned_int>.storage_.
                                                        value_ = local_5c0;
                                                      }
                                                    }
                                                    else if (-1 < (int)local_5d4) {
                                                      (local_5e0->switch_case_limit).
                                                      super_OptionalBase<unsigned_int>.storage_.
                                                      value_ = local_5c0;
                                                      (local_5e0->switch_case_limit).
                                                      super_OptionalBase<unsigned_int>.init_ = true;
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    uVar3 = local_5d4;
                                                    if ((int)local_5d4 < 1) {
                                                      uVar3 = 0;
                                                    }
                                                    local_5e0->mission_var_begin = uVar3;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5bc = local_5bc & 0xffffff00;
                                                    if (-1 < (int)local_5d4) {
                                                      local_5bc = local_5d4;
                                                    }
                                                    options = local_5e0;
                                                    if ((local_5e0->mission_var_limit).
                                                        super_OptionalBase<unsigned_int>.init_ ==
                                                        true) {
                                                      if ((int)local_5d4 < 0) {
                                                        (local_5e0->mission_var_limit).
                                                        super_OptionalBase<unsigned_int>.init_ =
                                                             false;
                                                      }
                                                      else {
                                                        (local_5e0->mission_var_limit).
                                                        super_OptionalBase<unsigned_int>.storage_.
                                                        value_ = local_5bc;
                                                      }
                                                    }
                                                    else if (-1 < (int)local_5d4) {
                                                      (local_5e0->mission_var_limit).
                                                      super_OptionalBase<unsigned_int>.storage_.
                                                      value_ = local_5bc;
                                                      (local_5e0->mission_var_limit).
                                                      super_OptionalBase<unsigned_int>.init_ = true;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->use_local_offsets = true;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->skip_cutscene = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->text_label_vars = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->streamed_scripts = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->fconst = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->farrays = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->allow_underscore_identifiers =
                                                         local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->scope_then_label = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->allow_break_continue = true;
                                                    options = local_5e0;
                                                  }
                                                  }
                                                  else {
                                                    local_5e0->fswitch = local_5e1;
                                                    options = local_5e0;
                                                  }
                                                }
                                                else {
                                                  local_5e0->relax_not = local_5e1;
                                                  options = local_5e0;
                                                }
                                              }
                                              else {
                                                local_5e0->script_name_check = local_5e1;
                                                options = local_5e0;
                                              }
                                            }
                                            else {
                                              local_5e0->entity_tracking = local_5e1;
                                              options = local_5e0;
                                            }
                                          }
                                          else {
                                            local_5e0->optimize_andor = true;
                                            local_5e0->optimize_zero_floats = true;
                                            options = local_5e0;
                                          }
                                        }
                                        else {
                                          local_5e0->optimize_zero_floats = local_5e1;
                                          options = local_5e0;
                                        }
                                      }
                                      else {
                                        local_5e0->optimize_andor = local_5e1;
                                        options = local_5e0;
                                      }
                                    }
                                    else {
                                      local_5e0->has_text_label_prefix = local_5e1;
                                      options = local_5e0;
                                    }
                                  }
                                  else {
                                    options->use_half_float = local_5e1;
                                  }
                                }
                                else {
                                  options->oatc = local_5e1;
                                }
                              }
                              else {
                                options->headerless = true;
                              }
                            }
                            else {
                              iVar2 = strcmp(pcVar4,"gta3");
                              if (iVar2 == 0) {
                                options->header = GTA3;
                              }
                              else {
                                iVar2 = strcmp(pcVar4,"gtavc");
                                if (iVar2 == 0) {
                                  options->header = GTAVC;
                                }
                                else {
                                  iVar2 = strcmp(pcVar4,"gtasa");
                                  if (iVar2 != 0) {
                                    parse_args();
                                    goto LAB_0017c777;
                                  }
                                  options->header = GTASA;
                                }
                              }
                            }
                          }
                          else {
                            iVar2 = strcmp(pcVar4,"default");
                            if (iVar2 == 0) {
                              options->error_format = Default;
                            }
                            else {
                              iVar2 = strcmp(pcVar4,"json");
                              if (iVar2 != 0) {
                                parse_args();
LAB_0017c777:
                                bVar1 = true;
                                goto LAB_0017ccec;
                              }
                              options->error_format = JSON;
                            }
                          }
                        }
                        else {
                          std::__cxx11::string::operator=(local_520,pcVar4);
                        }
                      }
                      else {
                        std::experimental::filesystem::v1::__cxx11::path::operator=
                                  (&local_5b0->datadir,(char **)&local_4c8);
                      }
                    }
                    else {
                      std::
                      vector<std::experimental::filesystem::v1::__cxx11::path,std::allocator<std::experimental::filesystem::v1::__cxx11::path>>
                      ::emplace_back<char_const*&>(local_518,(char **)&local_508);
                    }
                  }
                }
                else {
                  local_448[0]._M_pathname._M_dataplus._M_p = pcVar4;
                  local_448[0]._M_pathname._M_string_length = strlen(pcVar4);
                  bVar1 = Options::push_expect_var(options,(string_view *)local_448);
                  if (!bVar1) {
                    parse_args();
                    goto LAB_0017c777;
                  }
                }
              }
            }
          }
LAB_0017ccea:
          bVar1 = false;
        }
        else {
          std::experimental::filesystem::v1::__cxx11::path::operator=(local_5a8,&local_510);
LAB_0017c678:
          bVar1 = false;
          options = local_5e0;
        }
LAB_0017ccec:
        if (bVar1) {
          return false;
        }
      }
      else {
        if ((local_5b8->_M_pathname)._M_string_length != 0) {
          parse_args();
          return false;
        }
        std::experimental::filesystem::v1::__cxx11::path::operator=(local_5b8,ppcVar11);
        *argv = *argv + 1;
      }
      ppcVar11 = *argv;
      pcVar4 = *ppcVar11;
    } while (pcVar4 != (char *)0x0);
  }
  return true;
}

Assistant:

bool parse_args(char**& argv, fs::path& input, fs::path& output, DataInfo& data, ConfigInfo& conf, Options& options)
{
    try
    {
        bool flag;
        int32_t temp_i32;

        while(*argv)
        {
            if(**argv != '-')
            {
                if(!input.empty())
                {
                    fprintf(stderr, "gta3sc: error: input file appears twice\n");
                    return false;
                }

                input = *argv;
                ++argv;
            }
            else if(optget(argv, "-h", "--help", 0))
            {
                options.help = true;
                return true;
            }
            else if(optget(argv, nullptr, "--version", 0))
            {
                options.version = true;
                return true;
            }
            else if(const char* o = optget(argv, "-o", nullptr, 1))
            {
                output = o;
            }
            else if(optget(argv, nullptr, "-pedantic-errors", 0))
            {
                options.pedantic = true;
                options.pedantic_errors = true;
            }
            else if(optget(argv, nullptr, "-pedantic", 0))
            {
                options.pedantic = true;
            }
            else if(optget(argv, nullptr, "--guesser", 0))
            {
                options.guesser = true;
            }
            else if(const char* info = optget(argv, nullptr, "--expect-var", 1))
            {
                if(!options.push_expect_var(info))
                {
                    fprintf(stderr, "gta3sc: error: failed to parse --expect-var entry\n");
                    return false;
                }
            }
            else if(optget(argv, nullptr, "--recursive-traversal", 0))
            {
                options.linear_sweep = false;
            }
            else if(const char* name = optget(argv, nullptr, "--config", 1))
            {
                // avoid infinite recursion of parse_args(...) calls
                if(iequal_to()(conf.config_name, name))
                    continue;

                conf.config_name = name;

                if(auto opt_cmdline = read_file_utf8(config_path() / conf.config_name / "commandline.txt"))
                {
                    auto& cmdline = *opt_cmdline;
                    small_vector<char*, 128> args;

                    auto it = !cmdline.empty()? &cmdline[0] : nullptr;
                    auto end = it + cmdline.size();
                    for(; it != end; )
                    {
                        it = std::find_if_not(it, end, ::isspace);
                        args.emplace_back(it);
                        it = std::find_if(it, end, ::isspace);
                        if(it != end) *it++ = '\0';
                    }
                    args.emplace_back(nullptr);

                    char** argv2 = args.data();
                    if(!parse_args(argv2, input, output, data, conf, options))
                        return false;
                }
                else
                {
                    fprintf(stderr, "gta3sc: error: config path is missing commandline.txt file\n");
                    return false;
                }
            }
            else if(const char* path = optget(argv, nullptr, "--add-config", 1))
            {
                conf.add_config_files.emplace_back(path);
            }
            else if(const char* path = optget(argv, nullptr, "--datadir", 1))
            {
                data.datadir = path;
            }
            else if(const char* name = optget(argv, nullptr, "--levelfile", 1))
            {
                data.levelfile = name;
            }
            else if(const char* name = optget(argv, nullptr, "--error-format", 1))
            {
                if(!strcmp(name, "default"))
                    options.error_format = Options::ErrorFormat::Default;
                else if(!strcmp(name, "json"))
                    options.error_format = Options::ErrorFormat::JSON;
                else
                {
                    fprintf(stderr, "gta3sc: error: invalid error-format\n");
                    return false;
                }
            }
            else if(const char* ver = optget(argv, nullptr, "-mheader", 1))
            {
                if(!strcmp(ver, "gta3"))
                    options.header = Options::HeaderVersion::GTA3;
                else if(!strcmp(ver, "gtavc"))
                    options.header = Options::HeaderVersion::GTAVC;
                else if(!strcmp(ver, "gtasa"))
                    options.header = Options::HeaderVersion::GTASA;
                else
                {
                    fprintf(stderr, "gta3sc: error: invalid header version, must be 'gta3', 'gtavc' or 'gtasa'\n");
                    return false;
                }
            }
            else if(optflag(argv, "-mno-header", nullptr))
            {
                options.headerless = true;
            }
            else if(optflag(argv, "-moatc", &flag))
            {
                options.oatc = flag;
            }
            else if(optflag(argv, "-mq11.4", &flag))
            {
                options.use_half_float = flag;
            }
            else if(optflag(argv, "-mtyped-text-label", &flag))
            {
                options.has_text_label_prefix = flag;
            }
            else if(optflag(argv, "-moptimize-andor", &flag))
            {
                options.optimize_andor = flag;
            }
            else if(optflag(argv, "-moptimize-zero", &flag))
            {
                options.optimize_zero_floats = flag;
            }
            else if(optget(argv, nullptr, "-O", 0))
            {
                options.optimize_andor = true;
                options.optimize_zero_floats = true;
            }
            else if(optflag(argv, "-fentity-tracking", &flag))
            {
                options.entity_tracking = flag;
            }
            else if(optflag(argv, "-fscript-name-check", &flag))
            {
                options.script_name_check = flag;
            }
            else if(optflag(argv, "-frelax-not", &flag))
            {
                options.relax_not = flag;
            }
            else if(optflag(argv, "-fswitch", &flag))
            {
                options.fswitch = flag;
            }
            else if(optflag(argv, "-fbreak-continue", nullptr))
            {
                options.allow_break_continue = true;
            }
            else if(optflag(argv, "-fscope-then-label", &flag))
            {
                options.scope_then_label = flag;
            }
            else if(optflag(argv, "-funderscore-idents", &flag))
            {
                options.allow_underscore_identifiers = flag;
            }
            else if(optflag(argv, "-farrays", &flag))
            {
                options.farrays = flag;
            }
            else if(optflag(argv, "-fconst", &flag))
            {
                options.fconst = flag;
            }
            else if(optflag(argv, "-fstreamed-scripts", &flag))
            {
                options.streamed_scripts = flag;
            }
            else if(optflag(argv, "-ftext-label-vars", &flag))
            {
                options.text_label_vars = flag;
            }
            else if(optflag(argv, "-fskip-cutscene", &flag))
            {
                options.skip_cutscene = flag;
            }
            else if(optflag(argv, "-mlocal-offsets", nullptr))
            {
                options.use_local_offsets = true;
            }
            else if(optint(argv, "-ftimer-index", &options.timer_index)) {}
            else if(optint(argv, "-flocal-var-limit", &options.local_var_limit)) {}
            else if(optint(argv, "-fmission-var-limit", &temp_i32))
            {
                options.mission_var_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optint(argv, "-fmission-var-begin", &temp_i32))
            {
                options.mission_var_begin = std::max(0, temp_i32);
            }
            else if(optint(argv, "-fswitch-case-limit", &temp_i32))
            {
                options.switch_case_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optint(argv, "-farray-elem-limit", &temp_i32))
            {
                options.array_elem_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optflag(argv, "-fsyntax-only", nullptr))
            {
                options.fsyntax_only = true;
            }
            else if(optflag(argv, "-emit-ir2", nullptr))
            {
                options.emit_ir2 = true;
            }
            else if(optflag(argv, "-fcleo", nullptr))
            {
                options.cleo.emplace(0);
            }
            else if(optget(argv, nullptr, "--cs", 0))
            {
                options.cleo.emplace(0);
                options.output_cleo = true;
                options.mission_script = false;
                options.headerless = true;
                options.use_local_offsets = true;
            }
            else if(optget(argv, nullptr, "--cm", 0))
            {
                options.cleo.emplace(0);
                options.output_cleo = true;
                options.mission_script = true;
                options.headerless = true;
                options.use_local_offsets = true;
            }
            else if(optflag(argv, "-fmission-script", nullptr))
            {
                options.mission_script = true;
            }
            else if(optflag(argv, "-Werror", &flag))
            {
                options.warning_is_error = flag;
            }
            else if(optflag(argv, "-Wconflict-text-label-var", &flag))
            {
                options.warn_conflict_text_label_var = flag;
            }
            else if(optflag(argv, "-Wexpect-var", &flag))
            {
                options.warn_expect_var = flag;
            }
            else if(optflag(argv, "-fconstant-checks", &flag))
            {
                options.constant_checks = flag;
            }
            else if(const char* name = optget(argv, "-D", "--define", 1))
            {
                options.define(name);
            }
            else if(const char* name = optget(argv, "-U", "--undefine", 1))
            {
                options.undefine(name);
            }
            else
            {
                fprintf(stderr, "gta3sc: error: unregonized argument '%s'\n", *argv);
                return false;
            }
        }

        return true;
    }
    catch(const invalid_opt& e)
    {
        fprintf(stderr, "gta3sc: error: %s\n", e.what());
        return false;
    }
}